

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes_hash.cpp
# Opt level: O3

void hashAndFillAes1Rx4<false>(void *scratchpad,size_t scratchpadSize,void *hash,void *fill_state)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  bool bVar4;
  undefined1 (*pauVar5) [16];
  bool bVar6;
  uint8_t *scratchpadPtr;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  
  auVar3 = _DAT_00110280;
  auVar2 = _DAT_00110270;
  auVar1 = _DAT_00110260;
  auVar11 = _DAT_00110250;
  auVar15 = *fill_state;
  auVar14 = *(undefined1 (*) [16])((long)fill_state + 0x10);
  auVar13 = *(undefined1 (*) [16])((long)fill_state + 0x20);
  auVar12 = *(undefined1 (*) [16])((long)fill_state + 0x30);
  pauVar5 = (undefined1 (*) [16])((long)scratchpad + (scratchpadSize - 0x1000));
  auVar7 = _DAT_00110220;
  auVar8 = _DAT_00110210;
  auVar9 = _DAT_00110200;
  auVar10 = _DAT_001101f0;
  bVar4 = true;
  do {
    for (; bVar6 = bVar4, scratchpad < pauVar5; scratchpad = (void *)((long)scratchpad + 0x40)) {
      auVar12 = aesenc(auVar12,auVar3);
      auVar13 = aesdec(auVar13,auVar2);
      auVar14 = aesenc(auVar14,auVar1);
      auVar15 = aesdec(auVar15,auVar11);
      auVar10 = aesenc(auVar10,*scratchpad);
      auVar9 = aesdec(auVar9,*(undefined1 (*) [16])((long)scratchpad + 0x10));
      auVar8 = aesenc(auVar8,*(undefined1 (*) [16])((long)scratchpad + 0x20));
      auVar7 = aesdec(auVar7,*(undefined1 (*) [16])((long)scratchpad + 0x30));
      *(undefined1 (*) [16])scratchpad = auVar15;
      *(undefined1 (*) [16])((long)scratchpad + 0x10) = auVar14;
      *(undefined1 (*) [16])((long)scratchpad + 0x20) = auVar13;
      *(undefined1 (*) [16])((long)scratchpad + 0x30) = auVar12;
      bVar4 = bVar6;
    }
    pauVar5 = pauVar5 + 0x100;
    bVar4 = false;
  } while (bVar6);
  *(undefined1 (*) [16])fill_state = auVar15;
  *(undefined1 (*) [16])((long)fill_state + 0x10) = auVar14;
  *(undefined1 (*) [16])((long)fill_state + 0x20) = auVar13;
  auVar15 = _DAT_00110230;
  auVar11 = aesenc(auVar10,_DAT_00110230);
  auVar13 = aesdec(auVar9,_DAT_00110230);
  auVar14 = aesenc(auVar8,_DAT_00110230);
  *(undefined1 (*) [16])((long)fill_state + 0x30) = auVar12;
  auVar15 = aesdec(auVar7,auVar15);
  auVar12 = aesenc(auVar11,_DAT_00110240);
  auVar13 = aesdec(auVar13,_DAT_00110240);
  auVar14 = aesenc(auVar14,_DAT_00110240);
  auVar15 = aesdec(auVar15,_DAT_00110240);
  *(undefined1 (*) [16])hash = auVar12;
  *(undefined1 (*) [16])((long)hash + 0x10) = auVar13;
  *(undefined1 (*) [16])((long)hash + 0x20) = auVar14;
  *(undefined1 (*) [16])((long)hash + 0x30) = auVar15;
  return;
}

Assistant:

void hashAndFillAes1Rx4(void *scratchpad, size_t scratchpadSize, void *hash, void* fill_state) {
	uint8_t* scratchpadPtr = (uint8_t*)scratchpad;
	const uint8_t* scratchpadEnd = scratchpadPtr + scratchpadSize;

	// initial state
	rx_vec_i128 hash_state0 = rx_set_int_vec_i128(AES_HASH_1R_STATE0);
	rx_vec_i128 hash_state1 = rx_set_int_vec_i128(AES_HASH_1R_STATE1);
	rx_vec_i128 hash_state2 = rx_set_int_vec_i128(AES_HASH_1R_STATE2);
	rx_vec_i128 hash_state3 = rx_set_int_vec_i128(AES_HASH_1R_STATE3);

	const rx_vec_i128 key0 = rx_set_int_vec_i128(AES_GEN_1R_KEY0);
	const rx_vec_i128 key1 = rx_set_int_vec_i128(AES_GEN_1R_KEY1);
	const rx_vec_i128 key2 = rx_set_int_vec_i128(AES_GEN_1R_KEY2);
	const rx_vec_i128 key3 = rx_set_int_vec_i128(AES_GEN_1R_KEY3);

	rx_vec_i128 fill_state0 = rx_load_vec_i128((rx_vec_i128*)fill_state + 0);
	rx_vec_i128 fill_state1 = rx_load_vec_i128((rx_vec_i128*)fill_state + 1);
	rx_vec_i128 fill_state2 = rx_load_vec_i128((rx_vec_i128*)fill_state + 2);
	rx_vec_i128 fill_state3 = rx_load_vec_i128((rx_vec_i128*)fill_state + 3);

	constexpr int PREFETCH_DISTANCE = 4096;
	const char* prefetchPtr = ((const char*)scratchpad) + PREFETCH_DISTANCE;
	scratchpadEnd -= PREFETCH_DISTANCE;

	for (int i = 0; i < 2; ++i) {
		//process 64 bytes at a time in 4 lanes
		while (scratchpadPtr < scratchpadEnd) {
			hash_state0 = aesenc<softAes>(hash_state0, rx_load_vec_i128((rx_vec_i128*)scratchpadPtr + 0));
			hash_state1 = aesdec<softAes>(hash_state1, rx_load_vec_i128((rx_vec_i128*)scratchpadPtr + 1));
			hash_state2 = aesenc<softAes>(hash_state2, rx_load_vec_i128((rx_vec_i128*)scratchpadPtr + 2));
			hash_state3 = aesdec<softAes>(hash_state3, rx_load_vec_i128((rx_vec_i128*)scratchpadPtr + 3));

			fill_state0 = aesdec<softAes>(fill_state0, key0);
			fill_state1 = aesenc<softAes>(fill_state1, key1);
			fill_state2 = aesdec<softAes>(fill_state2, key2);
			fill_state3 = aesenc<softAes>(fill_state3, key3);

			rx_store_vec_i128((rx_vec_i128*)scratchpadPtr + 0, fill_state0);
			rx_store_vec_i128((rx_vec_i128*)scratchpadPtr + 1, fill_state1);
			rx_store_vec_i128((rx_vec_i128*)scratchpadPtr + 2, fill_state2);
			rx_store_vec_i128((rx_vec_i128*)scratchpadPtr + 3, fill_state3);

			rx_prefetch_t0(prefetchPtr);

			scratchpadPtr += 64;
			prefetchPtr += 64;
		}
		prefetchPtr = (const char*) scratchpad;
		scratchpadEnd += PREFETCH_DISTANCE;
	}

	rx_store_vec_i128((rx_vec_i128*)fill_state + 0, fill_state0);
	rx_store_vec_i128((rx_vec_i128*)fill_state + 1, fill_state1);
	rx_store_vec_i128((rx_vec_i128*)fill_state + 2, fill_state2);
	rx_store_vec_i128((rx_vec_i128*)fill_state + 3, fill_state3);

	//two extra rounds to achieve full diffusion
	rx_vec_i128 xkey0 = rx_set_int_vec_i128(AES_HASH_1R_XKEY0);
	rx_vec_i128 xkey1 = rx_set_int_vec_i128(AES_HASH_1R_XKEY1);

	hash_state0 = aesenc<softAes>(hash_state0, xkey0);
	hash_state1 = aesdec<softAes>(hash_state1, xkey0);
	hash_state2 = aesenc<softAes>(hash_state2, xkey0);
	hash_state3 = aesdec<softAes>(hash_state3, xkey0);

	hash_state0 = aesenc<softAes>(hash_state0, xkey1);
	hash_state1 = aesdec<softAes>(hash_state1, xkey1);
	hash_state2 = aesenc<softAes>(hash_state2, xkey1);
	hash_state3 = aesdec<softAes>(hash_state3, xkey1);

	//output hash
	rx_store_vec_i128((rx_vec_i128*)hash + 0, hash_state0);
	rx_store_vec_i128((rx_vec_i128*)hash + 1, hash_state1);
	rx_store_vec_i128((rx_vec_i128*)hash + 2, hash_state2);
	rx_store_vec_i128((rx_vec_i128*)hash + 3, hash_state3);
}